

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_dv.c
# Opt level: O0

void dtl_dv_delete(dtl_dv_t *dv)

{
  dtl_dv_type_id dVar1;
  dtl_dv_t *dv_local;
  
  if (dv != (dtl_dv_t *)0x0) {
    dVar1 = dtl_dv_type(dv);
    switch(dVar1) {
    case DTL_DV_INVALID:
      break;
    case DTL_DV_NULL:
      free(dv);
      break;
    case DTL_DV_SCALAR:
      dtl_sv_delete((dtl_sv_t *)dv);
      break;
    case DTL_DV_ARRAY:
      dtl_av_delete((dtl_av_t *)dv);
      break;
    case DTL_DV_HASH:
      dtl_hv_delete((dtl_hv_t *)dv);
    }
  }
  return;
}

Assistant:

void dtl_dv_delete(dtl_dv_t* dv ){
	if(dv){
		switch(dtl_dv_type(dv))
		{
		case DTL_DV_INVALID:
			break;
		case DTL_DV_NULL:
			free(dv);
			break;
		case DTL_DV_SCALAR:
			dtl_sv_delete((dtl_sv_t*) dv);
			break;
		case DTL_DV_ARRAY:
			dtl_av_delete((dtl_av_t*) dv);
			break;
		case DTL_DV_HASH:
			dtl_hv_delete((dtl_hv_t*) dv);
			break;
		}
	}
}